

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall
Catch::Option<Catch::TagAlias>::Option(Option<Catch::TagAlias> *this,TagAlias *_value)

{
  pointer pcVar1;
  
  *(char **)this->storage = this->storage + 0x10;
  pcVar1 = (_value->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this->storage,pcVar1,pcVar1 + (_value->tag)._M_string_length);
  *(char **)(this->storage + 0x20) = this->storage + 0x30;
  pcVar1 = (_value->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this->storage + 0x20),pcVar1,
             pcVar1 + (_value->lineInfo).file._M_string_length);
  *(size_t *)(this->storage + 0x40) = (_value->lineInfo).line;
  this->nullableValue = (TagAlias *)this->storage;
  return;
}

Assistant:

Option( T const& _value )
        : nullableValue( new( storage ) T( _value ) )
        {}